

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ArenaStringPtr::Release_abi_cxx11_(ArenaStringPtr *this)

{
  void *pvVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string *psVar6;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) == 0) {
    psVar6 = (string *)0x0;
  }
  else {
    psVar6 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
    if (((ulong)pvVar1 & 1) != 0) {
      psVar4 = (string *)operator_new(0x20);
      (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      if (((ulong)pvVar1 & 2) == 0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar4,pcVar2,pcVar2 + psVar6->_M_string_length);
        psVar6 = psVar4;
      }
      else {
        paVar5 = &psVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar5) {
          uVar3 = *(undefined8 *)((long)&psVar6->field_2 + 8);
          (psVar4->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
          *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar3;
        }
        else {
          (psVar4->_M_dataplus)._M_p = pcVar2;
          (psVar4->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        psVar4->_M_string_length = psVar6->_M_string_length;
        (psVar6->_M_dataplus)._M_p = (pointer)paVar5;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        psVar6 = psVar4;
      }
    }
    (this->tagged_ptr_).ptr_ = &fixed_address_empty_string_abi_cxx11_;
  }
  return psVar6;
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}